

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O1

StmNode * __thiscall Translator::visit(Translator *this,StmtListNode *stmtListNode)

{
  StmtNode *pSVar1;
  int iVar2;
  int iVar3;
  SEQ *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if ((stmtListNode == (StmtListNode *)0x0) ||
     (pSVar1 = stmtListNode->stmt, pSVar1 == (StmtNode *)0x0)) {
    this_00 = (SEQ *)0x0;
  }
  else {
    if (stmtListNode->next == (StmtListNode *)0x0) {
      iVar2 = (*(pSVar1->super_ASTNode)._vptr_ASTNode[4])(pSVar1,this);
      return (StmNode *)CONCAT44(extraout_var_01,iVar2);
    }
    this_00 = (SEQ *)operator_new(0x20);
    iVar2 = (*(pSVar1->super_ASTNode)._vptr_ASTNode[4])(pSVar1,this);
    iVar3 = (*(stmtListNode->next->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                      (stmtListNode->next,this);
    SEQ::SEQ(this_00,(StmNode *)CONCAT44(extraout_var,iVar2),
             (StmNode *)CONCAT44(extraout_var_00,iVar3));
  }
  return &this_00->super_StmNode;
}

Assistant:

StmNode *Translator::visit(StmtListNode *stmtListNode) {
    if (stmtListNode && stmtListNode->getStmt()) {
        if (stmtListNode->getNext() != nullptr) {
            return new SEQ(stmtListNode->getStmt()->accept(this), stmtListNode->getNext()->accept(this));
        } else {
            return stmtListNode->getStmt()->accept(this);
        }
    } else {
        return NULL;
    }
}